

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O0

float __thiscall SVGChart::LogTrafo::Transform(LogTrafo *this,float inValue)

{
  float fVar1;
  float local_14;
  float inValue_local;
  LogTrafo *this_local;
  
  local_14 = inValue;
  if (inValue < 1e-10) {
    local_14 = 1e-10;
  }
  fVar1 = SafeLog(local_14,this->mBase,this->mFactor);
  return fVar1 * this->mSlope + this->mOffset;
}

Assistant:

float LogTrafo::Transform (float inValue) const{
      if (inValue<kLogMinClipValue) {
        inValue = kLogMinClipValue;
      }
      return SafeLog (inValue, mBase, mFactor)*mSlope+mOffset;
    }